

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_error adios2_engine_openmode(adios2_mode *mode,adios2_engine *engine)

{
  adios2_mode aVar1;
  adios2_mode *in_RDI;
  Mode m;
  Engine *engineCpp;
  string *in_stack_ffffffffffffff78;
  string local_80 [4];
  Mode in_stack_ffffffffffffff84;
  allocator local_39;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  adios2_engine *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"for const adios2_engine, in call to adios2_engine_openmode",&local_39);
  adios2::helper::CheckForNullptr<adios2_engine_const>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  adios2::core::Engine::OpenMode();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,"in adios2_engine_openmode()",(allocator *)&stack0xffffffffffffff7f);
  aVar1 = anon_unknown.dwarf_205d4::adios2_fromMode
                    (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
  *in_RDI = aVar1;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_engine_openmode(adios2_mode *mode, const adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(
            engine, "for const adios2_engine, in call to adios2_engine_openmode");

        const adios2::core::Engine *engineCpp =
            reinterpret_cast<const adios2::core::Engine *>(engine);

        auto m = engineCpp->OpenMode();
        *mode = adios2_fromMode(m, "in adios2_engine_openmode()");
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_engine_openmode"));
    }
}